

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O0

Vec4 __thiscall glcts::Blend(glcts *this,Vec4 *rgb,Vec4 *src,Vec4 *dst)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  undefined8 extraout_XMM0_Qa;
  ulong uVar4;
  Vec4 VVar5;
  Vector<float,_4> local_88;
  Vector<float,_4> local_78;
  Vector<float,_4> local_68;
  Vector<float,_4> local_58;
  undefined1 local_48 [8];
  Vec4 rgbOut;
  float alpha;
  float p [3];
  Vec4 *dst_local;
  Vec4 *src_local;
  Vec4 *rgb_local;
  
  rgbOut.m_data[3] = GetP0(src,dst);
  fVar2 = GetP1(src,dst);
  fVar3 = GetP2(src,dst);
  rgbOut.m_data[2] = rgbOut.m_data[3] + fVar2 + fVar3;
  tcu::operator*((tcu *)&local_68,rgbOut.m_data[3],rgb);
  tcu::operator*((tcu *)&local_78,fVar2,src);
  tcu::operator+((tcu *)&local_58,&local_68,&local_78);
  tcu::operator*((tcu *)&local_88,fVar3,dst);
  tcu::operator+((tcu *)local_48,&local_58,&local_88);
  pfVar1 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_48,0);
  fVar2 = *pfVar1;
  pfVar1 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_48,1);
  fVar3 = *pfVar1;
  pfVar1 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_48,2);
  uVar4 = (ulong)(uint)fVar3;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this,fVar2,fVar3,*pfVar1,rgbOut.m_data[2]);
  VVar5.m_data[2] = (float)(int)uVar4;
  VVar5.m_data[3] = (float)(int)(uVar4 >> 0x20);
  VVar5.m_data[0] = (float)(int)extraout_XMM0_Qa;
  VVar5.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (Vec4)VVar5.m_data;
}

Assistant:

static tcu::Vec4 Blend(const tcu::Vec4& rgb, const tcu::Vec4& src, const tcu::Vec4& dst)
{
	float	 p[3]   = { GetP0(src, dst), GetP1(src, dst), GetP2(src, dst) };
	float	 alpha  = p[0] + p[1] + p[2];
	tcu::Vec4 rgbOut = (p[0] * rgb) + (p[1] * src) + (p[2] * dst);
	return tcu::Vec4(rgbOut[0], rgbOut[1], rgbOut[2], alpha);
}